

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseShape.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<double> *paVar1;
  double dVar2;
  double dVar3;
  value_type vVar4;
  result_type rVar5;
  unsigned_long uVar6;
  undefined8 uVar7;
  ulong uVar8;
  int iVar9;
  ostream *poVar10;
  char *pcVar11;
  size_type sVar12;
  reference pvVar13;
  reference pvVar14;
  iterator __first;
  iterator __last;
  double dVar15;
  double local_470;
  double skew;
  double sigma;
  double median;
  undefined1 local_448 [8];
  vector<double,_std::allocator<double>_> NonBlank;
  double dStack_428;
  int j;
  double mean;
  double offset0;
  double rRange [4];
  double range [4];
  double area [2];
  undefined1 local_3c0 [8];
  normal_distribution<double> distribution2;
  double soFar;
  double fraction;
  value_type local_388;
  undefined1 local_380 [8];
  vector<double,_std::allocator<double>_> driftT;
  value_type local_360;
  undefined1 local_358 [8];
  vector<double,_std::allocator<double>_> T0X;
  value_type local_338;
  undefined1 local_330 [8];
  vector<double,_std::allocator<double>_> S1f30;
  value_type local_310;
  undefined1 local_308 [8];
  vector<double,_std::allocator<double>_> S2width;
  value_type local_2e8;
  undefined1 local_2e0 [8];
  vector<double,_std::allocator<double>_> CI_right;
  value_type local_2c0;
  undefined1 local_2b8 [8];
  vector<double,_std::allocator<double>_> CI_left;
  value_type local_298;
  undefined1 local_290 [8];
  vector<double,_std::allocator<double>_> S2max;
  value_type local_270;
  undefined1 local_268 [8];
  vector<double,_std::allocator<double>_> S2tot;
  value_type local_248;
  undefined1 local_240 [8];
  vector<double,_std::allocator<double>_> S1tot;
  double local_220;
  double promptFrac;
  value_type local_210;
  undefined1 local_208 [8];
  vector<double,_std::allocator<double>_> S1inner;
  value_type local_1e8;
  undefined1 local_1e0 [8];
  vector<double,_std::allocator<double>_> S1total;
  value_type local_1c0;
  undefined1 local_1b8 [8];
  vector<double,_std::allocator<double>_> count;
  value_type local_198;
  undefined1 local_190 [8];
  vector<double,_std::allocator<double>_> means;
  double range_1 [4];
  ulong local_150;
  ulong local_148;
  uint64_t i;
  double e;
  double d;
  double c;
  double b;
  double a;
  FILE *local_108;
  FILE *ifp;
  vector<double,_std::allocator<double>_> top;
  vector<double,_std::allocator<double>_> bot;
  vector<double,_std::allocator<double>_> tns;
  char line [60];
  vector<unsigned_long,_std::allocator<unsigned_long>_> win;
  vector<unsigned_long,_std::allocator<unsigned_long>_> num;
  uniform_real_distribution<double> distribution;
  default_random_engine generator;
  double MaxPossibleTime;
  double S1LimPE [2];
  char **argv_local;
  int argc_local;
  
  MaxPossibleTime = minS1;
  S1LimPE[0] = maxS1;
  if (verbosity < 2) {
    if (argc < 3) {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                "2 args needed: S1 (non-c) in phe (NOT phd). 1st value is min, 2nd max."
                               );
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      return 1;
    }
    MaxPossibleTime = atof(argv[1]);
    S1LimPE[0] = atof(argv[2]);
  }
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
             &distribution._M_param._M_b);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)
             &num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0,20.0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(line + 0x38));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&ifp);
  local_108 = fopen("photon_times.txt","r");
  local_148 = 0;
  while( true ) {
    while (local_148 == 0) {
      do {
        iVar9 = getc(local_108);
      } while (iVar9 != 10);
      local_148 = 1;
    }
    pcVar11 = fgets((char *)&tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,0x28,local_108);
    if (pcVar11 == (char *)0x0) break;
    if (verbosity < 2) {
      __isoc99_sscanf(&tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,"%lf\t%lf\t%lf\t%lf\t%lf",&b,&c,&d,
                      &e,&i);
    }
    else {
      __isoc99_sscanf(&tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,"%lf\t%lf",&b,&c);
    }
    iVar9 = feof(local_108);
    if (iVar9 != 0) goto LAB_00101aa9;
    local_150 = (long)b | (long)(b - 9.223372036854776e+18) & (long)b >> 0x3f;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_150);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&c);
    if (verbosity < 2) {
      if (1000.0 < c) {
        i = 0;
      }
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)
                 &top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&d);
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&ifp,&e);
      range_1[3] = (double)((long)(double)i |
                           (long)((double)i - 9.223372036854776e+18) & (long)(double)i >> 0x3f);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(line + 0x38),
                 (value_type_conflict1 *)(range_1 + 3));
    }
  }
  NUMEVT = (unsigned_long)((int)(long)b + 1);
  if (NUMEVT % 10 != 0) {
    std::operator<<((ostream *)&std::cerr,
                    "Warning! Check to see if last event(s) missing b/c S1=0.\n");
  }
LAB_00101aa9:
  fclose(local_108);
  uVar6 = NUMEVT;
  if (verbosity < 2) {
    local_248 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_240,uVar6,&local_248,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = NUMEVT;
    local_270 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&S2max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_268,uVar6,&local_270,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&S2max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = NUMEVT;
    local_298 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&CI_left.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_290,uVar6,&local_298,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&CI_left.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = NUMEVT;
    local_2c0 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&CI_right.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_2b8,uVar6,&local_2c0,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&CI_right.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = NUMEVT;
    local_2e8 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&S2width.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_2e0,uVar6,&local_2e8,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&S2width.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = NUMEVT;
    local_310 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&S1f30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_308,uVar6,&local_310,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&S1f30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = NUMEVT;
    local_338 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&T0X.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_330,uVar6,&local_338,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&T0X.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = NUMEVT;
    local_360 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&driftT.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_358,uVar6,&local_360,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&driftT.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = NUMEVT;
    local_388 = 0.0;
    std::allocator<double>::allocator((allocator<double> *)((long)&fraction + 7));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_380,uVar6,&local_388,
               (allocator<double> *)((long)&fraction + 7));
    std::allocator<double>::~allocator((allocator<double> *)((long)&fraction + 7));
    for (local_148 = 0; uVar8 = local_148,
        sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), uVar8 < sVar12;
        local_148 = local_148 + 1) {
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_358,*pvVar14);
      *pvVar13 = 1.79769313486232e+308;
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_148);
      if (1000.0 < *pvVar13 || *pvVar13 == 1000.0) {
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&ifp,local_148);
        dVar2 = *pvVar13;
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,local_148);
        dVar3 = *pvVar13;
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_268,*pvVar14);
        *pvVar13 = (dVar2 + dVar3) * 1.015 + *pvVar13;
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&ifp,local_148);
        dVar2 = *pvVar13;
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,local_148);
        dVar3 = *pvVar13;
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_290,*pvVar14);
        if (*pvVar13 <= dVar2 + dVar3 && dVar2 + dVar3 != *pvVar13) {
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)&ifp,local_148);
          dVar2 = *pvVar13;
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_148);
          dVar3 = *pvVar13;
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &win.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_290,*pvVar14);
          *pvVar13 = dVar2 + dVar3;
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_148);
          dVar2 = *pvVar13;
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &win.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_380,*pvVar14);
          *pvVar13 = dVar2 - 1000.0;
        }
      }
      else {
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&ifp,local_148);
        dVar2 = *pvVar13;
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,local_148);
        dVar3 = *pvVar13;
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_240,*pvVar14);
        *pvVar13 = dVar2 + dVar3 + *pvVar13;
      }
    }
    distribution2._M_saved_available = false;
    distribution2._25_7_ = 0;
    for (local_148 = 0; uVar8 = local_148,
        sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), uVar8 < sVar12;
        local_148 = local_148 + 1) {
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_148);
      if (1000.0 <= *pvVar13) {
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_308,*pvVar14);
        if ((*pvVar13 == 0.0) && (!NAN(*pvVar13))) {
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)&ifp,local_148);
          dVar2 = *pvVar13;
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_148);
          dVar2 = (dVar2 + *pvVar13) * 1.015 + (double)distribution2._24_8_;
          distribution2._24_8_ = dVar2;
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &win.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_268,*pvVar14);
          if (*pvVar13 * 0.0225 < dVar2) {
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &win.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_2b8,*pvVar14);
            if ((*pvVar13 == 0.0) && (!NAN(*pvVar13))) {
              pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &win.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)local_2e0,*pvVar14);
              if ((*pvVar13 == 0.0) && (!NAN(*pvVar13))) {
                pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)
                                     &bot.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
                vVar4 = *pvVar13;
                pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &win.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
                pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)local_2b8,*pvVar14);
                *pvVar13 = vVar4;
              }
            }
          }
          uVar7 = distribution2._24_8_;
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &win.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_268,*pvVar14);
          if (*pvVar13 * 0.5 < (double)uVar7) {
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &win.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_2e0,*pvVar14);
            if ((*pvVar13 == 0.0) && (!NAN(*pvVar13))) {
              pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &win.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)local_2b8,*pvVar14);
              if ((*pvVar13 != 0.0) || (NAN(*pvVar13))) {
                pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)
                                     &bot.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
                vVar4 = *pvVar13;
                pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                     &win.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
                pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)local_2e0,*pvVar14);
                *pvVar13 = vVar4;
              }
            }
          }
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &win.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_2b8,*pvVar14);
          if ((*pvVar13 != 0.0) || (NAN(*pvVar13))) {
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &win.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_2e0,*pvVar14);
            if ((*pvVar13 != 0.0) || (NAN(*pvVar13))) {
              pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &win.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)local_2e0,*pvVar14);
              dVar2 = *pvVar13;
              pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &win.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)local_2b8,*pvVar14);
              dVar3 = *pvVar13;
              pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &win.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)local_308,*pvVar14);
              *pvVar13 = (dVar2 - dVar3) / 2.0;
              distribution2._M_saved_available = false;
              distribution2._25_7_ = 0;
            }
          }
        }
      }
    }
    distribution2._M_saved_available = false;
    distribution2._25_7_ = 0;
    std::normal_distribution<double>::normal_distribution
              ((normal_distribution<double> *)local_3c0,0.05,0.017499999999999998);
    for (local_148 = 0; uVar8 = local_148,
        sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), uVar8 < sVar12;
        local_148 = local_148 + 1) {
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_148);
      if (*pvVar13 <= 1000.0 && *pvVar13 != 1000.0) {
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_358,*pvVar14);
        if (1.79769313486232e+308 <= *pvVar13) {
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)&ifp,local_148);
          dVar2 = *pvVar13;
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_148);
          distribution2._24_8_ = (double)distribution2._24_8_ + dVar2 + *pvVar13;
          soFar = std::normal_distribution<double>::operator()
                            ((normal_distribution<double> *)local_3c0,
                             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                              *)&distribution._M_param._M_b);
          uVar7 = distribution2._24_8_;
          if (soFar < 0.0) {
            soFar = 0.0;
          }
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &win.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_240,*pvVar14);
          if (soFar * *pvVar13 < (double)uVar7) {
            pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 &win.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_358,*pvVar14);
            if (1.79769313486232e+308 <= *pvVar13) {
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,local_148);
              vVar4 = *pvVar13;
              pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   &win.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
              pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)local_358,*pvVar14);
              *pvVar13 = vVar4;
              distribution2._M_saved_available = false;
              distribution2._25_7_ = 0;
            }
          }
        }
      }
    }
    memset(range + 3,0,0x10);
    range[0] = 134.0;
    range[1] = -8.0;
    range[2] = 32.0;
    offset0 = -14.0;
    rRange[0] = 134.0;
    rRange[1] = -8.0;
    rRange[2] = 32.0;
    for (local_148 = 0; uVar8 = local_148,
        sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), uVar8 < sVar12;
        local_148 = local_148 + 1) {
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_358,*pvVar14);
      if (*pvVar13 < 1.79769313486232e+308) {
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_358,*pvVar14);
        dVar2 = *pvVar13;
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,local_148);
        *pvVar13 = *pvVar13 - dVar2;
      }
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_148);
      dVar2 = *pvVar13;
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_358,*pvVar14);
      if ((1000.0 - *pvVar13 <= dVar2) ||
         (pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               (line + 0x38),local_148), *pvVar14 != 1)) {
        rVar5 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)
                           &num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                           &distribution._M_param._M_b);
        dVar2 = rVar5 + 0.0;
        offset0 = dVar2 + -14.0;
        rRange[0] = range[0] + dVar2;
        rRange[1] = range[1] + dVar2;
        rRange[2] = range[2] + dVar2;
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_330,*pvVar14);
        if (((((*pvVar13 == 0.0) && (!NAN(*pvVar13))) && ((range[3] != 0.0 || (NAN(range[3]))))) &&
            ((area[0] != 0.0 || (NAN(area[0]))))) &&
           ((range[3] != area[0] || (NAN(range[3]) || NAN(area[0]))))) {
          dVar2 = area[0] / range[3];
          pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &win.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_330,*pvVar14);
          *pvVar13 = dVar2;
        }
        range[3] = 0.0;
        area[0] = 0.0;
      }
      else {
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,local_148);
        if ((offset0 < *pvVar13) &&
           (pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,local_148),
           *pvVar13 < rRange[0])) {
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)&ifp,local_148);
          dVar2 = *pvVar13;
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_148);
          range[3] = dVar2 + *pvVar13 + range[3];
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_148);
          if ((rRange[1] < *pvVar13) &&
             (pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                  ((vector<double,_std::allocator<double>_> *)
                                   &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage,local_148),
             *pvVar13 < rRange[2])) {
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)&ifp,local_148);
            dVar2 = *pvVar13;
            pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,local_148);
            area[0] = dVar2 + *pvVar13 + area[0];
          }
        }
      }
    }
    dStack_428 = 0.0;
    NonBlank.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_448);
    std::operator<<((ostream *)&std::cout,
                    "evt#\tS1, pe\tpromptFrac\tdrift [ms]\tS2, pe\tWidth [ns]\n");
    for (local_148 = 0; local_148 < NUMEVT; local_148 = local_148 + 1) {
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_240,local_148);
      if ((((*pvVar13 <= MaxPossibleTime) ||
           (pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_268,local_148),
           *pvVar13 <= 0.0)) ||
          (pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_330,local_148),
          *pvVar13 <= 0.0)) ||
         ((pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_330,local_148),
          1.0 < *pvVar13 || *pvVar13 == 1.0 ||
          (pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)local_240,local_148),
          S1LimPE[0] <= *pvVar13)))) {
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_148);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      }
      else {
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_330,local_148);
        dStack_428 = dStack_428 + *pvVar13;
        NonBlank.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._4_4_ =
             NonBlank.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_148);
        poVar10 = std::operator<<(poVar10,"\t");
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_240,local_148);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pvVar13);
        poVar10 = std::operator<<(poVar10,"\t");
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_330,local_148);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pvVar13);
        poVar10 = std::operator<<(poVar10,"\t");
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_380,local_148);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pvVar13 / 1000000.0);
        poVar10 = std::operator<<(poVar10,"\t");
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_268,local_148);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pvVar13);
        poVar10 = std::operator<<(poVar10,"\t");
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_308,local_148);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,*pvVar13);
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_330,local_148);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)local_448,pvVar13);
      }
    }
    if (NonBlank.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._4_4_ == 0) {
      std::operator<<((ostream *)&std::cerr,"no events in range!\n");
      argv_local._4_4_ = 1;
    }
    else {
      dStack_428 = dStack_428 /
                   (double)NonBlank.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_;
      __first = std::vector<double,_std::allocator<double>_>::begin
                          ((vector<double,_std::allocator<double>_> *)local_448);
      __last = std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)local_448);
      std::sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 __first._M_current,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 __last._M_current);
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_448,
                           (long)(NonBlank.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ / 2));
      dVar2 = *pvVar13;
      skew = 0.0;
      for (local_148 = 0; local_148 < NUMEVT; local_148 = local_148 + 1) {
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_330,local_148);
        if (((*pvVar13 != 0.0) || (NAN(*pvVar13))) &&
           ((pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)local_240,local_148),
            MaxPossibleTime < *pvVar13 &&
            (pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)local_240,local_148),
            *pvVar13 < S1LimPE[0])))) {
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_330,local_148);
          dVar3 = *pvVar13;
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_330,local_148);
          skew = (dStack_428 - dVar3) * (dStack_428 - *pvVar13) + skew;
        }
      }
      dVar3 = sqrt(skew / ((double)NonBlank.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ - 1.0));
      local_470 = 0.0;
      for (local_148 = 0; local_148 < NUMEVT; local_148 = local_148 + 1) {
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_330,local_148);
        if ((((*pvVar13 != 0.0) || (NAN(*pvVar13))) &&
            (pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)local_240,local_148),
            MaxPossibleTime < *pvVar13)) &&
           (pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)local_240,local_148),
           *pvVar13 < S1LimPE[0])) {
          pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_330,local_148);
          dVar15 = pow((*pvVar13 - dStack_428) / dVar3,3.0);
          local_470 = dVar15 + local_470;
        }
      }
      dVar15 = (double)NonBlank.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_;
      std::operator<<((ostream *)&std::cerr,"MEDIAN\t\tSIGMA\t\tSKEWNESS\n");
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,dVar2);
      poVar10 = std::operator<<(poVar10,"\t");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,dVar3);
      poVar10 = std::operator<<(poVar10,"\t");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_470 / dVar15);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 0;
    }
    S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_448);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_380);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_358);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_330);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_308);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_2e0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_2b8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_290);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_268);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_240);
  }
  else {
    range_1[1] = -69.7;
    range_1[2] = 196.2;
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0xc069000000000000;
    range_1[0] = 200.0;
    local_198 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&count.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_190,uVar6,&local_198,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&count.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = NUMEVT;
    local_1c0 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&S1total.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_1b8,uVar6,&local_1c0,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&S1total.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = NUMEVT;
    local_1e8 = 0.0;
    paVar1 = (allocator<double> *)
             ((long)&S1inner.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<double>::allocator(paVar1);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_1e0,uVar6,&local_1e8,paVar1);
    std::allocator<double>::~allocator
              ((allocator<double> *)
               ((long)&S1inner.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    uVar6 = NUMEVT;
    local_210 = 0.0;
    std::allocator<double>::allocator((allocator<double> *)((long)&promptFrac + 7));
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_208,uVar6,&local_210,
               (allocator<double> *)((long)&promptFrac + 7));
    std::allocator<double>::~allocator((allocator<double> *)((long)&promptFrac + 7));
    for (local_148 = 0; uVar8 = local_148,
        sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), uVar8 < sVar12;
        local_148 = local_148 + 1) {
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_148);
      if (*pvVar13 <= 10000.0 && *pvVar13 != 10000.0) {
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_1b8,*pvVar14);
        *pvVar13 = *pvVar13 + 1.0;
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)
                             &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,local_148);
        dVar2 = *pvVar13;
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_190,*pvVar14);
        *pvVar13 = dVar2 + *pvVar13;
      }
    }
    for (local_148 = 0; local_148 < NUMEVT; local_148 = local_148 + 1) {
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_1b8,local_148);
      dVar2 = *pvVar13;
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_190,local_148);
      *pvVar13 = *pvVar13 / dVar2;
    }
    for (local_148 = 0; uVar8 = local_148,
        sVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), uVar8 < sVar12;
        local_148 = local_148 + 1) {
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_190,*pvVar14);
      dVar2 = *pvVar13;
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_148);
      *pvVar13 = *pvVar13 - dVar2;
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_148);
      if (((double)means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage <= *pvVar13) &&
         (pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_148),
         *pvVar13 <= range_1[0])) {
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_1e0,*pvVar14);
        *pvVar13 = *pvVar13 + 1.0;
      }
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,local_148);
      if ((range_1[1] <= *pvVar13) &&
         (pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)
                               &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,local_148),
         *pvVar13 <= range_1[2])) {
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_148);
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_208,*pvVar14);
        *pvVar13 = *pvVar13 + 1.0;
      }
    }
    poVar10 = std::operator<<((ostream *)&std::cout,"evt#\tpromptFrac");
    std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    for (local_148 = 0; local_148 < NUMEVT; local_148 = local_148 + 1) {
      local_220 = 0.0;
      pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_1e0,local_148);
      if (0.0 < *pvVar13) {
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_208,local_148);
        local_220 = *pvVar13;
        pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_1e0,local_148);
        local_220 = local_220 / *pvVar13;
      }
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_148);
      poVar10 = std::operator<<(poVar10,"\t");
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,local_220);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
    }
    argv_local._4_4_ = 0;
    S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_208);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_1e0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_1b8);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_190);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&ifp);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(line + 0x38));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             &win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return argv_local._4_4_;
}

Assistant:

int main ( int argc, char** argv ) {
  
  double S1LimPE[2] = { minS1, maxS1 };
  
  if ( verbosity < 2 ) {
    if ( argc < 3 ) {
      cerr << "2 args needed: S1 (non-c) in phe (NOT phd). 1st value is min, 2nd "
	      "max."
	   << endl;
      return EXIT_FAILURE;
    }
    else {
      S1LimPE[0] = atof(argv[1]); S1LimPE[1] = atof(argv[2]);  // avoid Seg Fault!
    }
  }
  
  double MaxPossibleTime = DBL_MAX; default_random_engine generator;
  uniform_real_distribution<double> distribution(
      0., 20.);  // ns for ran offset. 2 bin default. For Case: -7,0
  // for LUX Run03: better results with -4 to 16. Still 2 samples-wide, but
  // different centering
  vector<uint64_t> num, win;
  char line[60];
  vector<double> tns, bot, top;
  FILE* ifp = fopen("photon_times.txt", "r");
  double a, b, c, d, e;
  uint64_t i = 0;

  while (1) {
    if (i == 0) {
      while (getc(ifp) != '\n') {
        ;
      }
      i = 1;
      continue;
    }
    if (fgets(line, 40, ifp) == NULL) {
      NUMEVT = unsigned(a) + 1;
      if ( NUMEVT % 10 )
        cerr << "Warning! Check to see if last event(s) missing b/c S1=0.\n";
      break;
    } else ;
    if ( verbosity < 2 )
      sscanf(line, "%lf\t%lf\t%lf\t%lf\t%lf", &a, &b, &c, &d, &e);
    else
      sscanf(line, "%lf\t%lf", &a, &b);
    if (feof(ifp)) break;
    num.push_back(uint64_t(a));
    tns.push_back(b);
    if ( verbosity < 2 ) {
      if (b > S2BORD) e = 0;
      bot.push_back(c);
      top.push_back(d);
      win.push_back(uint64_t(e));
    }
    // cerr << a << " " << b << " " << c << " " << d << " " << e << endl;
  }
  fclose(ifp);
  
  if ( verbosity >= 2 ) { //for pseudo-S1-only spike mode
    double range[4] = {-200., 200., -69.7, 196.2};
    vector<double> means(NUMEVT, 0.);
    vector<double> count(NUMEVT, 0.);
    vector<double> S1total(NUMEVT, 0.);
    vector<double> S1inner(NUMEVT, 0.);
    for ( i = 0; i < num.size(); ++i ) {
      if ( tns[i] < 1e4 ) {
	++count[num[i]];
	means[num[i]] += tns[i];
      }
    }
    for ( i = 0; i < NUMEVT; ++i ) means[i] /= count[i];
    for ( i = 0; i < num.size(); ++i ) {
      tns[i] -= means[num[i]]; //correction on means
      if ( tns[i] >= range[0] && tns[i] <= range[1] )
	++S1total[num[i]];
      if ( tns[i] >= range[2] && tns[i] <= range[3] )
	++S1inner[num[i]];
    }
    cout << "evt#\tpromptFrac" << endl;
    for ( i = 0; i < NUMEVT; ++i ) {
      double promptFrac = 0.0;
      if ( S1total[i] > 0. )
	promptFrac = S1inner[i] / S1total[i];
      cout << i << "\t" << promptFrac << endl;
    }
    return EXIT_SUCCESS;
  }
  
  vector<double> S1tot(NUMEVT, 0.);
  vector<double> S2tot(NUMEVT, 0.);
  vector<double> S2max(NUMEVT, 0.);
  vector<double> CI_left(NUMEVT, 0.);
  vector<double> CI_right(NUMEVT, 0.);
  vector<double> S2width(NUMEVT, 0.);
  vector<double> S1f30(NUMEVT, 0.);
  vector<double> T0X(NUMEVT, 0.);
  vector<double> driftT(NUMEVT, 0.);

  for (i = 0; i < num.size(); ++i) {
    T0X[num[i]] = MaxPossibleTime;
    if (tns[i] < S2BORD)
      S1tot[num[i]] += top[i] + bot[i];
    else {
      S2tot[num[i]] += (top[i] + bot[i]) * LOSTAREA;
      if ((top[i] + bot[i]) > S2max[num[i]]) {
        S2max[num[i]] = top[i] + bot[i];
        driftT[num[i]] =
            tns[i] -
            S2BORD;  // minus 1 microsecond fudge factor to get mean drift
      } else
        ;
    }
  }
  double fraction = 0.0225,
         soFar = 0.;  // default Confidence Interval is 95.5% (~2-sigma)
  for (i = 0; i < num.size(); ++i) {
    if (tns[i] >= S2BORD && S2width[num[i]] == 0.) {
      soFar += (top[i] + bot[i]) * LOSTAREA;
      if (soFar > fraction * S2tot[num[i]] && CI_left[num[i]] == 0. &&
          CI_right[num[i]] == 0.)
        CI_left[num[i]] = tns[i];
      if (soFar > 0.500000 * S2tot[num[i]] && CI_right[num[i]] == 0. &&
          CI_left[num[i]] != 0.)
        CI_right[num[i]] = tns[i];  // left half only because of asymmetry
      if (CI_left[num[i]] != 0. && CI_right[num[i]] != 0.) {
        S2width[num[i]] = (CI_right[num[i]] - CI_left[num[i]]) / 2.;
        soFar = 0.0;
        continue;
      }  // div by 2 as 1s--1s=2sigma
    }
  }
  soFar = 0.00;
  normal_distribution<double> distribution2(RISEDEF, RISEDEF * UNC);
  for (i = 0; i < num.size(); ++i) {
    if (tns[i] < S2BORD && T0X[num[i]] >= MaxPossibleTime) {
      soFar += top[i] + bot[i];
      fraction = distribution2(generator);
      if (fraction < 0.) fraction = 0.;
      if (soFar > (fraction * S1tot[num[i]]) &&
          T0X[num[i]] >= MaxPossibleTime) {
        T0X[num[i]] = tns[i]; //time of "actual" S1 peak start
        soFar = 0.0;
        continue;
      }
    }
  }

  double area[2] = {0.0, 0.0};
  double range[4] = {-14., 134., -8., 32.};
  double rRange[4] = {range[0], range[1], range[2],
                      range[3]};  // Dahl: -50,300,-50,10
  for (i = 0; i < num.size(); ++i) {
    if (T0X[num[i]] < MaxPossibleTime) tns[i] -= T0X[num[i]];
    if (tns[i] < (S2BORD - T0X[num[i]]) && win[i] == 1) {
      if (tns[i] > rRange[0] && tns[i] < rRange[1]) {
        area[0] += top[i] + bot[i];
        if (tns[i] > rRange[2] && tns[i] < rRange[3])
          area[1] += top[i] + bot[i];
      }
    } else {
      double offset0 =
          0.0 +
          distribution(generator);  // consider unique offset for each
                                    // range[]. In original try makes bumps
      // double offset1 = 10.+distribution(generator);
      // double offset2 = 10.+distribution(generator);
      // double offset3 = 10.+distribution(generator);
      // randomized offset was to create extra smearing to better match real data with unknowns in the DAQ
      rRange[0] = range[0] + offset0;
      rRange[1] = range[1] + offset0;
      rRange[2] = range[2] + offset0;
      rRange[3] = range[3] + offset0;
      if (S1f30[num[i]] == 0. && area[0] != 0. && area[1] != 0. &&
          area[0] != area[1])
        S1f30[num[i]] = area[1] / area[0];
      area[0] = 0.0;
      area[1] = 0.0;
    }
  }

  double mean = 0.0;
  int j = 0;
  vector<double> NonBlank;
  cout << "evt#\tS1, pe\tpromptFrac\tdrift [ms]\tS2, pe\tWidth [ns]\n";
  for (i = 0; i < NUMEVT; ++i) {
    // cerr << T0X[i] << endl;
    if (S1tot[i] > S1LimPE[0] && S2tot[i] > 0. && S1f30[i] > 0. &&
        S1f30[i] < 1. && S1tot[i] < S1LimPE[1]) {
      mean += S1f30[i];
      ++j;
      cout << i << "\t" << S1tot[i] << "\t" << S1f30[i] << "\t"
           << driftT[i] / 1e6 << "\t" << S2tot[i] << "\t" << S2width[i] << endl;
      NonBlank.push_back(S1f30[i]);
    } else
      cout << i << endl;
  }
  if (j == 0) {
    cerr << "no events in range!\n";
    return EXIT_FAILURE;
  }
  mean /= double(j);
  std::sort(NonBlank.begin(), NonBlank.end());
  double median = NonBlank[j / 2];

  double sigma = 0.0;
  for (i = 0; i < NUMEVT; ++i)
    if (S1f30[i] != 0. && S1tot[i] > S1LimPE[0] && S1tot[i] < S1LimPE[1])
      sigma += (mean - S1f30[i]) * (mean - S1f30[i]);
  sigma /= (double(j) - 1.);
  sigma = sqrt(sigma);
  double skew = 0.0;
  for (i = 0; i < NUMEVT; ++i)
    if (S1f30[i] != 0. && S1tot[i] > S1LimPE[0] && S1tot[i] < S1LimPE[1])
      skew += pow((S1f30[i] - mean) / sigma, 3.);
  skew /= double(j);
  cerr << "MEDIAN\t\tSIGMA\t\tSKEWNESS\n";
  cerr << median << "\t" << sigma << "\t" << skew
       << endl;  // can switch to "mean," as desired, but change the header name
                 // too :)
  
  return EXIT_SUCCESS;
  
}